

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void exit_test(int quit_application)

{
  char *__s;
  size_t sVar1;
  long *in_FS_OFFSET;
  
  __s = getenv("CMOCKA_TEST_ABORT");
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    if (((sVar1 == 1) && (global_skip_test == '\0')) && (*__s == '1')) {
      print_error("%s",*(undefined8 *)(*in_FS_OFFSET + -0x110));
      abort();
    }
  }
  if (*(int *)(*in_FS_OFFSET + -0x108) == 0) {
    exit(-1);
  }
  siglongjmp((__jmp_buf_tag *)(*in_FS_OFFSET + -0x100),1);
}

Assistant:

static void exit_test(const int quit_application)
{
    const char *env = getenv("CMOCKA_TEST_ABORT");
    int abort_test = 0;

    if (env != NULL && strlen(env) == 1) {
        abort_test = (env[0] == '1');
    }

    if (global_skip_test == 0 &&
        abort_test == 1) {
        print_error("%s", cm_error_message);
        abort();
    } else if (global_running_test) {
        cm_longjmp(global_run_test_env, 1);
    } else if (quit_application) {
        exit(-1);
    }
}